

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytobin.cpp
# Opt level: O0

void __thiscall
VulnerabilityToBin::VulnerabilityToBin
          (VulnerabilityToBin *this,int maxDamageBinIdx,char *binFileName,char *idxFileName,
          bool useIndexFile,bool zip,bool allIntensityBinsCheck)

{
  FILE *pFVar1;
  bool allIntensityBinsCheck_local;
  bool zip_local;
  bool useIndexFile_local;
  char *idxFileName_local;
  char *binFileName_local;
  int maxDamageBinIdx_local;
  VulnerabilityToBin *this_local;
  
  ValidateVulnerability::ValidateVulnerability
            (&this->super_ValidateVulnerability,allIntensityBinsCheck);
  (this->super_ValidateVulnerability)._vptr_ValidateVulnerability =
       (_func_int **)&PTR_WriteBinVulnerabilityFile_00110d10;
  *(int *)&(this->super_ValidateVulnerability).field_0x30b4 = maxDamageBinIdx;
  this->zip_ = zip;
  this->fileOutBin_ = (FILE *)0x0;
  this->fileOutIdx_ = (FILE *)0x0;
  (this->vIdx_).vulnerability_id = 0;
  (this->vIdx_).offset = 0;
  (this->vIdx_).size = 0;
  (this->vIdx_).original_size = 0;
  this->rowCount_ = 0;
  std::vector<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>::vector
            (&this->vulnerabilityRows_);
  strcpy((this->super_ValidateVulnerability).super_Validate.fileDescription_,"Vulnerability");
  (this->super_ValidateVulnerability).convertToBin_ = true;
  (this->super_ValidateVulnerability).useIndexFile_ = useIndexFile;
  if (((this->super_ValidateVulnerability).useIndexFile_ & 1U) == 0) {
    this->fileOutBin_ = _stdout;
  }
  else {
    pFVar1 = fopen(binFileName,"wb");
    this->fileOutBin_ = (FILE *)pFVar1;
    pFVar1 = fopen(idxFileName,"wb");
    this->fileOutIdx_ = (FILE *)pFVar1;
  }
  return;
}

Assistant:

VulnerabilityToBin::VulnerabilityToBin(const int maxDamageBinIdx,
				       const char* binFileName,
				       const char* idxFileName,
				       const bool useIndexFile, const bool zip,
				       const bool allIntensityBinsCheck) :
  ValidateVulnerability(allIntensityBinsCheck),
  maxDamageBinIdx_(maxDamageBinIdx), zip_(zip) {

  strcpy(fileDescription_, "Vulnerability");
  convertToBin_ = true;
  useIndexFile_ = useIndexFile;
  if (useIndexFile_) {
    fileOutBin_ = fopen(binFileName, "wb");
    fileOutIdx_ = fopen(idxFileName, "wb");
  } else {
    fileOutBin_ = stdout;
  }

}